

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O0

void * __thiscall RichHdrWrapper::getFieldPtr(RichHdrWrapper *this,size_t fieldId,size_t subField)

{
  size_t sVar1;
  size_t compIdNum;
  size_t cnt;
  size_t subField_local;
  size_t fieldId_local;
  RichHdrWrapper *this_local;
  
  if ((this->richSign == (RICH_SIGNATURE *)0x0) || (this->dansHdr == (RICH_DANS_HEADER *)0x0)) {
    this_local = (RichHdrWrapper *)0x0;
  }
  else if (this->compIdCounter == 0) {
    this_local = (RichHdrWrapper *)0x0;
  }
  else {
    sVar1 = this->compIdCounter;
    switch(fieldId) {
    case 0:
      this_local = (RichHdrWrapper *)this->dansHdr;
      break;
    case 1:
      this_local = (RichHdrWrapper *)this->dansHdr->cPad;
      break;
    case 2:
      this_local = (RichHdrWrapper *)(this->dansHdr->cPad + 1);
      break;
    case 3:
      this_local = (RichHdrWrapper *)(this->dansHdr->cPad + 2);
      break;
    default:
      if ((fieldId < 4) || (sVar1 + 3 < fieldId)) {
        if (fieldId == sVar1 + 4) {
          this_local = (RichHdrWrapper *)this->richSign;
        }
        else if (fieldId == sVar1 + 5) {
          this_local = (RichHdrWrapper *)&this->richSign->checksum;
        }
        else {
          this_local = (RichHdrWrapper *)this->dansHdr;
        }
      }
      else {
        this_local = (RichHdrWrapper *)(this->dansHdr->cPad + fieldId * 2 + -5);
      }
    }
  }
  return this_local;
}

Assistant:

void* RichHdrWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    if (!this->richSign || !this->dansHdr) {
        return NULL;
    }
    if (this->compIdCounter == 0) {
        return NULL;
    }

    const size_t cnt = this->compIdCounter - 1;
    switch (fieldId) {
         case DANS_ID: return (void*) &dansHdr->dansId;
         case CPAD0: return (void*) &dansHdr->cPad[0];
         case CPAD1: return (void*) &dansHdr->cPad[1];
         case CPAD2: return (void*) &dansHdr->cPad[2];
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        size_t compIdNum = fieldId - COMP_ID_1;
        return (void*)(ULONGLONG(&dansHdr->compId) + (sizeof(pe::RICH_COMP_ID)*compIdNum));
    }
    if (fieldId == RICH_ID + cnt) return (void*) &richSign->richId;
    if (fieldId == CHECKSUM + cnt) return (void*) &richSign->checksum;
    return (void*) dansHdr;
}